

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<QPersistentModelIndex,QEditorInfo>::emplace_helper<QEditorInfo_const&>
          (QHash<QPersistentModelIndex,_QEditorInfo> *this,QPersistentModelIndex *key,
          QEditorInfo *args)

{
  long lVar1;
  piter it;
  piter pVar2;
  Node<QPersistentModelIndex,_QEditorInfo> *in_RDX;
  Data<QHashPrivate::Node<QPersistentModelIndex,_QEditorInfo>_> *in_RSI;
  long in_FS_OFFSET;
  InsertionResult result;
  iterator *in_stack_ffffffffffffff88;
  Data<QHashPrivate::Node<QPersistentModelIndex,_QEditorInfo>_> *in_stack_ffffffffffffff90;
  QPersistentModelIndex *in_stack_ffffffffffffff98;
  undefined8 local_30;
  undefined8 local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QHashPrivate::Data<QHashPrivate::Node<QPersistentModelIndex,_QEditorInfo>_>::
  findOrInsert<QPersistentModelIndex>(in_RSI,&in_RDX->key);
  QHashPrivate::iterator<QHashPrivate::Node<QPersistentModelIndex,_QEditorInfo>_>::node
            ((iterator<QHashPrivate::Node<QPersistentModelIndex,_QEditorInfo>_> *)in_RDX);
  QHashPrivate::Node<QPersistentModelIndex,QEditorInfo>::createInPlace<QEditorInfo_const&>
            (in_RDX,in_stack_ffffffffffffff98,(QEditorInfo *)in_stack_ffffffffffffff90);
  it.bucket = (size_t)in_stack_ffffffffffffff98;
  it.d = in_stack_ffffffffffffff90;
  QHash<QPersistentModelIndex,_QEditorInfo>::iterator::iterator(in_stack_ffffffffffffff88,it);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  pVar2.bucket = local_28;
  pVar2.d = local_30;
  return (iterator)pVar2;
}

Assistant:

iterator emplace_helper(Key &&key, Args &&... args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->emplaceValue(std::forward<Args>(args)...);
        return iterator(result.it);
    }